

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O2

void __thiscall
btMultiBodyPoint2Point::btMultiBodyPoint2Point
          (btMultiBodyPoint2Point *this,btMultiBody *bodyA,int linkA,btMultiBody *bodyB,int linkB,
          btVector3 *pivotInA,btVector3 *pivotInB)

{
  undefined8 uVar1;
  float local_24;
  
  btMultiBodyConstraint::btMultiBodyConstraint
            (&this->super_btMultiBodyConstraint,bodyA,bodyB,linkA,linkB,3,false);
  (this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint =
       (_func_int **)&PTR__btMultiBodyPoint2Point_001f2198;
  this->m_rigidBodyA = (btRigidBody *)0x0;
  this->m_rigidBodyB = (btRigidBody *)0x0;
  uVar1 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_pivotInA).m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_pivotInA).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(pivotInB->m_floats + 2);
  *(undefined8 *)(this->m_pivotInB).m_floats = *(undefined8 *)pivotInB->m_floats;
  *(undefined8 *)((this->m_pivotInB).m_floats + 2) = uVar1;
  local_24 = 0.0;
  btAlignedObjectArray<float>::resize(&(this->super_btMultiBodyConstraint).m_data,3,&local_24);
  return;
}

Assistant:

btMultiBodyPoint2Point::btMultiBodyPoint2Point(btMultiBody* bodyA, int linkA, btMultiBody* bodyB, int linkB, const btVector3& pivotInA, const btVector3& pivotInB)
	:btMultiBodyConstraint(bodyA,bodyB,linkA,linkB,BTMBP2PCONSTRAINT_DIM,false),
	m_rigidBodyA(0),
	m_rigidBodyB(0),
	m_pivotInA(pivotInA),
	m_pivotInB(pivotInB)
{
    m_data.resize(BTMBP2PCONSTRAINT_DIM);//at least store the applied impulses
}